

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Local_tee(w3Interp *this)

{
  w3Frame **ppwVar1;
  ulong uVar2;
  w3Tag extraout_AL;
  w3Tag wVar3;
  w3Tag *pwVar4;
  Value *pVVar5;
  undefined8 extraout_RAX;
  w3Frame *pwVar6;
  ulong uVar7;
  ulong uVar8;
  w3Stack *unaff_R15;
  
  uVar7 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  uVar8 = uVar7;
  if (uVar7 < this->frame->param_and_local_count) {
    uVar2 = this->frame->param_count;
    unaff_R15 = &this->super_w3Stack;
    pwVar4 = w3Stack::tag(unaff_R15);
    wVar3 = *pwVar4;
    pwVar6 = this->frame;
    if (uVar7 < uVar2) {
      if (wVar3 != pwVar6->param_types[uVar7]) {
        pwVar4 = w3Stack::tag(unaff_R15);
        pwVar6 = (w3Frame *)(ulong)this->frame->param_types[uVar7];
        this = (w3Interp *)&stack0xffffffffffffffc0;
        StringFormat_abi_cxx11_((string *)this,"%X %lX",(ulong)*pwVar4);
        AssertFailedFormat("tag () == frame->param_types [i]",(string *)this);
        wVar3 = extraout_AL;
        goto LAB_0011bd74;
      }
    }
    else {
LAB_0011bd74:
      if (wVar3 != pwVar6->local_only_types[uVar7 - pwVar6->param_count]) goto LAB_0011be53;
    }
    pwVar4 = w3Stack::tag(unaff_R15);
    uVar8 = uVar7 * 0x30;
    if (*pwVar4 ==
        *(w3Tag *)((long)((this->frame->interp->stack->super_w3StackBase).super_w3StackBaseBase.
                          super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                          super__Vector_impl_data._M_start + this->frame->locals + uVar7) + 8)) {
      pVVar5 = w3Stack::value(unaff_R15);
      *(Value *)((long)((this->frame->interp->stack->super_w3StackBase).super_w3StackBaseBase.
                        super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                        super__Vector_impl_data._M_start + this->frame->locals + uVar7) + 0x10) =
           *pVVar5;
      return;
    }
  }
  else {
    this = (w3Interp *)&stack0xffffffffffffffc0;
    StringFormat_abi_cxx11_((string *)this,"%lX %lX",uVar7);
    AssertFailedFormat("i < frame->param_and_local_count",(string *)this);
  }
  pwVar4 = w3Stack::tag(unaff_R15);
  ppwVar1 = &this->frame;
  this = (w3Interp *)&stack0xffffffffffffffc0;
  StringFormat_abi_cxx11_
            ((string *)this,"%X %X",(ulong)*pwVar4,
             (ulong)*(byte *)((long)(((*ppwVar1)->interp->stack->super_w3StackBase).
                                     super_w3StackBaseBase.
                                     super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (*ppwVar1)->locals)
                              + 8U + uVar8));
  AssertFailedFormat("tag () == frame->Local (i).value.tag",(string *)this);
LAB_0011be53:
  pwVar4 = w3Stack::tag(unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)&stack0xffffffffffffffc0,"%X %X",(ulong)*pwVar4,
             (ulong)this->frame->local_only_types[uVar8 - this->frame->param_count]);
  AssertFailedFormat("tag () == frame->local_only_types [i - frame->param_count]",
                     (string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Local_tee)
{
    //__debugbreak ();
    const size_t i = instr->u32;
    AssertFormat (i < frame->param_and_local_count, ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, frame->param_and_local_count));
    if (i < frame->param_count)
        AssertFormat (tag () == frame->param_types [i], ("%X %" FORMAT_SIZE "X", tag (), frame->param_types [i]));
    else
        AssertFormat (tag () == frame->local_only_types [i - frame->param_count], ("%X %X", tag (), frame->local_only_types [i - frame->param_count]));
    AssertFormat (tag () == frame->Local (i).value.tag, ("%X %X", tag (), frame->Local (i).value.tag));
    frame->Local (i).value.value = value ();
}